

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprand.h
# Opt level: O2

uint32_t rprand_xoshiro(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = rprand_state_1 * 5;
  uVar1 = rprand_state_1 * 0x280;
  uVar4 = rprand_state_1 << 9;
  uVar5 = rprand_state_2 ^ rprand_state_0;
  uVar3 = rprand_state_1 ^ rprand_state_3;
  rprand_state_1 = uVar5 ^ rprand_state_1;
  rprand_state_0 = rprand_state_0 ^ uVar3;
  rprand_state_2 = uVar5 ^ uVar4;
  rprand_state_3 = uVar3 << 0xb | uVar3 >> 0x15;
  return (uVar1 | uVar2 >> 0x19) * 9;
}

Assistant:

uint32_t rprand_xoshiro(void)
{
    const uint32_t result = rprand_rotate_left(rprand_state[1]*5, 7)*9;
    const uint32_t t = rprand_state[1] << 9;

    rprand_state[2] ^= rprand_state[0];
    rprand_state[3] ^= rprand_state[1];
    rprand_state[1] ^= rprand_state[2];
    rprand_state[0] ^= rprand_state[3];
    
    rprand_state[2] ^= t;
    
    rprand_state[3] = rprand_rotate_left(rprand_state[3], 11);

    return result;
}